

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O3

bool __thiscall
kj::anon_unknown_35::InMemoryDirectory::Impl::tryTransferChild
          (Impl *this,EntryImpl *entry,Type type,
          Maybe<kj::Absolute<kj::Quantity<long,_kj::_::NanosecondLabel>,_kj::_::DateLabel>_>
          *lastModified,Maybe<unsigned_long> *size,Directory *fromDirectory,PathPtr fromPath,
          TransferMode mode)

{
  Impl *this_00;
  undefined8 *puVar1;
  Clock *pCVar2;
  undefined8 *puVar3;
  PathPtr fromPath_00;
  EntryImpl *pEVar4;
  String *pSVar5;
  size_t sVar6;
  bool bVar7;
  int iVar8;
  File *pFVar9;
  undefined4 extraout_var;
  map<kj::StringPtr,kj::(anonymous_namespace)::InMemoryDirectory::EntryImpl,std::less<kj::StringPtr>,std::allocator<std::pair<kj::StringPtr_const,kj::(anonymous_namespace)::InMemoryDirectory::EntryImpl>>>
  *this_01;
  anon_union_8_1_a8c68091_for_NullableValue<kj::Absolute<kj::Quantity<long,_kj::_::NanosecondLabel>,_kj::_::DateLabel>_>_2
  aVar10;
  Directory *fromDirectory_00;
  Disposer *pDVar11;
  Disposer *pDVar12;
  unsigned_long uVar13;
  long lVar14;
  long lVar15;
  StringPtr name;
  Own<kj::File> copy;
  ArrayDisposer *local_148;
  OneOf<kj::(anonymous_namespace)::InMemoryDirectory::FileNode,_kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode,_kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>
  local_140;
  Own<const_kj::File> local_118;
  undefined8 *local_108;
  File *local_100;
  OwnOwn<const_kj::Directory> subdir;
  OwnOwn<const_kj::File> file;
  OneOf<kj::(anonymous_namespace)::InMemoryDirectory::FileNode,_kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode,_kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>
  local_c0;
  AtomicRefcounted *refcounted;
  EntryImpl *local_90;
  Path filename;
  Maybe<unsigned_long> local_50;
  Maybe<kj::Absolute<kj::Quantity<long,_kj::_::NanosecondLabel>,_kj::_::DateLabel>_> local_40;
  undefined4 extraout_var_00;
  
  if (type == SYMLINK) {
    (*(fromDirectory->super_ReadableDirectory).super_FsNode._vptr_FsNode[0xc])
              (&copy,fromDirectory,fromPath.parts.ptr);
    file.value.disposer = (Disposer *)CONCAT71(file.value.disposer._1_7_,(char)copy.disposer);
    if ((char)copy.disposer != '\x01') {
      _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[49],kj::PathPtr&>
                ((Fault *)&copy,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem.c++"
                 ,0x621,FAILED,(char *)0x0,
                 "\"source node deleted concurrently during transfer\", fromPath",
                 (char (*) [49])"source node deleted concurrently during transfer",&fromPath);
      _::Debug::Fault::~Fault((Fault *)&copy);
      return false;
    }
    file.value.ptr = copy.ptr;
    local_90 = entry;
    aVar10._0_4_ = (**this->clock->_vptr_Clock)();
    pEVar4 = local_90;
    aVar10.value.value.value._4_4_ = extraout_var_00;
    if ((lastModified->ptr).isSet == true) {
      aVar10 = (lastModified->ptr).field_1;
    }
    file.value.ptr = (File *)0x0;
    copy.disposer = (Disposer *)aVar10;
    if ((local_90->node).tag != 0) {
      OneOf<kj::(anonymous_namespace)::InMemoryDirectory::FileNode,_kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode,_kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>
      ::destroy(&local_90->node);
    }
    (pEVar4->node).field_1.forceAligned = (void *)aVar10;
    *(File **)((long)&(pEVar4->node).field_1 + 8) = copy.ptr;
    *(ArrayDisposer **)((long)&(pEVar4->node).field_1 + 0x10) = local_148;
    *(undefined8 *)((long)&(pEVar4->node).field_1 + 0x18) = local_140._0_8_;
    (pEVar4->node).tag = 3;
    if (mode == MOVE) {
      iVar8 = (*(fromDirectory->super_ReadableDirectory).super_FsNode._vptr_FsNode[0x16])
                        (fromDirectory,fromPath.parts.ptr,fromPath.parts.size_);
      if ((char)iVar8 == '\0') {
        _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[19],kj::PathPtr&>
                  ((Fault *)&copy,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem.c++"
                   ,0x61b,FAILED,"fromDirectory.tryRemove(fromPath)",
                   "\"couldn\'t move node\", fromPath",(char (*) [19])"couldn\'t move node",
                   &fromPath);
        _::Debug::Fault::~Fault((Fault *)&copy);
        return false;
      }
      return true;
    }
    return true;
  }
  if (type != DIRECTORY) {
    if (type != FILE) {
      return false;
    }
    (*(fromDirectory->super_ReadableDirectory).super_FsNode._vptr_FsNode[0xd])
              (&copy,fromDirectory,fromPath.parts.ptr);
    fromDirectory_00 = (Directory *)copy.ptr;
    file.value.disposer = copy.disposer;
    file.value.ptr = copy.ptr;
    if (copy.ptr == (File *)0x0) {
      _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[49],kj::PathPtr&>
                ((Fault *)&copy,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem.c++"
                 ,0x5f2,FAILED,(char *)0x0,
                 "\"source node deleted concurrently during transfer\", fromPath",
                 (char (*) [49])"source node deleted concurrently during transfer",&fromPath);
      _::Debug::Fault::~Fault((Fault *)&copy);
      return false;
    }
    if (mode == MOVE) {
      iVar8 = (*(fromDirectory->super_ReadableDirectory).super_FsNode._vptr_FsNode[0x16])
                        (fromDirectory,fromPath.parts.ptr,fromPath.parts.size_);
      if ((char)iVar8 != '\0') goto LAB_0034891a;
      _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[19],kj::PathPtr&>
                ((Fault *)&copy,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem.c++"
                 ,0x5ea,FAILED,"fromDirectory.tryRemove(fromPath)",
                 "\"couldn\'t move node\", fromPath",(char (*) [19])"couldn\'t move node",&fromPath)
      ;
      _::Debug::Fault::~Fault((Fault *)&copy);
      bVar7 = false;
    }
    else if (mode == COPY) {
      newInMemoryFile((kj *)&copy,this->clock);
      uVar13 = 0xffffffffffffffff;
      if ((size->ptr).isSet == true) {
        uVar13 = (size->ptr).field_1.value;
      }
      (*((copy.ptr)->super_ReadableFile).super_FsNode._vptr_FsNode[0xd])
                (copy.ptr,0,fromDirectory_00,0,uVar13);
      local_118.disposer = copy.disposer;
      local_118.ptr = copy.ptr;
      copy.ptr = (File *)0x0;
      EntryImpl::set(entry,&local_118);
      pFVar9 = local_118.ptr;
      if (local_118.ptr != (File *)0x0) {
        local_118.ptr = (File *)0x0;
        (**(local_118.disposer)->_vptr_Disposer)
                  (local_118.disposer,
                   (_func_int *)
                   ((long)&(pFVar9->super_ReadableFile).super_FsNode._vptr_FsNode +
                   (long)(pFVar9->super_ReadableFile).super_FsNode._vptr_FsNode[-2]));
      }
      bVar7 = true;
    }
    else {
LAB_0034891a:
      EntryImpl::set(entry,&file.value);
      bVar7 = true;
      fromDirectory_00 = (Directory *)file.value.ptr;
      if (file.value.ptr == (File *)0x0) {
        return true;
      }
    }
    file.value.ptr = (File *)0x0;
    pDVar12 = file.value.disposer;
    goto LAB_00348942;
  }
  (*(fromDirectory->super_ReadableDirectory).super_FsNode._vptr_FsNode[0x11])
            (&file,fromDirectory,fromPath.parts.ptr);
  fromDirectory_00 = (Directory *)file.value.ptr;
  subdir.value.disposer = file.value.disposer;
  subdir.value.ptr = (Directory *)file.value.ptr;
  if (file.value.ptr == (File *)0x0) {
    _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[49],kj::PathPtr&>
              ((Fault *)&file,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem.c++"
               ,0x612,FAILED,(char *)0x0,
               "\"source node deleted concurrently during transfer\", fromPath",
               (char (*) [49])"source node deleted concurrently during transfer",&fromPath);
    _::Debug::Fault::~Fault((Fault *)&file);
    return false;
  }
  if (mode == MOVE) {
    iVar8 = (*(fromDirectory->super_ReadableDirectory).super_FsNode._vptr_FsNode[0x16])
                      (fromDirectory,fromPath.parts.ptr,fromPath.parts.size_);
    if ((char)iVar8 != '\0') goto LAB_003488d5;
    _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[19],kj::PathPtr&>
              ((Fault *)&file,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem.c++"
               ,0x60a,FAILED,"fromDirectory.tryRemove(fromPath)","\"couldn\'t move node\", fromPath"
               ,(char (*) [19])"couldn\'t move node",&fromPath);
    _::Debug::Fault::~Fault((Fault *)&file);
    bVar7 = false;
  }
  else {
    if (mode == COPY) {
      pCVar2 = this->clock;
      pFVar9 = (File *)operator_new(0x70);
      refcounted = (AtomicRefcounted *)(pFVar9 + 1);
      *(undefined4 *)&pFVar9[2].super_ReadableFile.super_FsNode._vptr_FsNode = 0;
      (pFVar9->super_ReadableFile).super_FsNode._vptr_FsNode = (_func_int **)&PTR_getFd_0044eae8;
      pFVar9[1].super_ReadableFile.super_FsNode._vptr_FsNode =
           (_func_int **)&PTR_disposeImpl_0044ebc0;
      local_100 = pFVar9;
      _::Mutex::Mutex((Mutex *)(pFVar9 + 3));
      pFVar9[6].super_ReadableFile.super_FsNode._vptr_FsNode = (_func_int **)pCVar2;
      *(undefined4 *)&pFVar9[8].super_ReadableFile.super_FsNode._vptr_FsNode = 0;
      pFVar9[9].super_ReadableFile.super_FsNode._vptr_FsNode = (_func_int **)0x0;
      pFVar9[10].super_ReadableFile.super_FsNode._vptr_FsNode = (_func_int **)(pFVar9 + 8);
      pFVar9[0xb].super_ReadableFile.super_FsNode._vptr_FsNode = (_func_int **)(pFVar9 + 8);
      pFVar9[0xc].super_ReadableFile.super_FsNode._vptr_FsNode = (_func_int **)0x0;
      iVar8 = (**pCVar2->_vptr_Clock)(pCVar2);
      pFVar9[0xd].super_ReadableFile.super_FsNode._vptr_FsNode =
           (_func_int **)CONCAT44(extraout_var,iVar8);
      LOCK();
      *(int *)&pFVar9[2].super_ReadableFile.super_FsNode._vptr_FsNode =
           *(int *)&pFVar9[2].super_ReadableFile.super_FsNode._vptr_FsNode + 1;
      UNLOCK();
      (*(((File *)fromDirectory_00)->super_ReadableFile).super_FsNode._vptr_FsNode[7])
                (&local_118,fromDirectory_00);
      pDVar12 = local_118.disposer;
      if (local_118.ptr != (File *)0x0) {
        this_00 = (Impl *)(local_100 + 6);
        this_01 = (map<kj::StringPtr,kj::(anonymous_namespace)::InMemoryDirectory::EntryImpl,std::less<kj::StringPtr>,std::allocator<std::pair<kj::StringPtr_const,kj::(anonymous_namespace)::InMemoryDirectory::EntryImpl>>>
                   *)(local_100 + 7);
        lVar15 = (long)local_118.ptr << 5;
        lVar14 = 0;
        local_90 = entry;
        do {
          copy.disposer = *(Disposer **)((long)&pDVar12[1]._vptr_Disposer + lVar14);
          copy.ptr = *(File **)((long)&pDVar12[2]._vptr_Disposer + lVar14);
          puVar3 = *(undefined8 **)((long)&pDVar12[3]._vptr_Disposer + lVar14);
          puVar1 = (undefined8 *)((long)&pDVar12[1]._vptr_Disposer + lVar14);
          *puVar1 = 0;
          puVar1[1] = 0;
          pDVar11 = copy.disposer;
          if (copy.ptr == (File *)0x0) {
            pDVar11 = (Disposer *)0x36d124;
          }
          local_140._0_8_ = local_140._0_8_ & 0xffffffff00000000;
          name.content.size_ =
               (long)&((copy.ptr)->super_ReadableFile).super_FsNode._vptr_FsNode +
               (ulong)(copy.ptr == (File *)0x0);
          name.content.ptr = (char *)pDVar11;
          Path::Path(&filename,name);
          local_40.ptr.isSet = false;
          local_50.ptr.isSet = false;
          fromPath_00.parts.size_ = filename.parts.size_;
          fromPath_00.parts.ptr = filename.parts.ptr;
          bVar7 = tryTransferChild(this_00,(EntryImpl *)&copy,
                                   *(Type *)((long)&pDVar12->_vptr_Disposer + lVar14),&local_40,
                                   &local_50,fromDirectory_00,fromPath_00,COPY);
          pFVar9 = copy.ptr;
          pDVar11 = copy.disposer;
          if (bVar7) {
            file.value.disposer = copy.disposer;
            if (copy.ptr == (File *)0x0) {
              file.value.disposer = (Disposer *)0x36d124;
            }
            file.value.ptr =
                 (File *)((long)&((copy.ptr)->super_ReadableFile).super_FsNode._vptr_FsNode +
                         (ulong)(copy.ptr == (File *)0x0));
            copy.disposer = (Disposer *)0x0;
            copy.ptr = (File *)0x0;
            local_c0.tag = local_140.tag;
            if (local_140.tag == 3) {
              local_c0.field_1.forceAligned = local_140.field_1.forceAligned;
              local_c0.field_1._8_8_ = local_140.field_1._8_8_;
              local_c0.field_1._16_8_ = local_140.field_1._16_8_;
              local_c0.field_1._24_8_ = local_140.field_1._24_8_;
              local_140.field_1._8_8_ = 0;
              local_140.field_1._16_8_ = 0;
            }
            else if ((local_140.tag == 2) || (local_140.tag == 1)) {
              local_c0.field_1.forceAligned = local_140.field_1.forceAligned;
              local_c0.field_1._8_8_ = local_140.field_1._8_8_;
              local_140.field_1._8_8_ = 0;
            }
            std::
            map<kj::StringPtr,kj::(anonymous_namespace)::InMemoryDirectory::EntryImpl,std::less<kj::StringPtr>,std::allocator<std::pair<kj::StringPtr_const,kj::(anonymous_namespace)::InMemoryDirectory::EntryImpl>>>
            ::
            insert<std::pair<kj::StringPtr,kj::(anonymous_namespace)::InMemoryDirectory::EntryImpl>>
                      (this_01,(pair<kj::StringPtr,_kj::(anonymous_namespace)::InMemoryDirectory::EntryImpl>
                                *)&file);
            OneOf<kj::(anonymous_namespace)::InMemoryDirectory::FileNode,_kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode,_kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>
            ::destroy(&local_c0);
            if (pDVar11 != (Disposer *)0x0) {
              (**(code **)*puVar3)(puVar3,pDVar11,1,pFVar9,pFVar9,0);
            }
          }
          else if (_::Debug::minSeverity < 3) {
            _::Debug::log<char_const(&)[62],kj::Path&>
                      ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem.c++"
                       ,0x601,ERROR,
                       "\"couldn\'t copy node of type not supported by InMemoryDirectory\", filename"
                       ,(char (*) [62])
                        "couldn\'t copy node of type not supported by InMemoryDirectory",&filename);
          }
          sVar6 = filename.parts.size_;
          pSVar5 = filename.parts.ptr;
          if (filename.parts.ptr != (String *)0x0) {
            filename.parts.ptr = (String *)0x0;
            filename.parts.size_ = 0;
            (**(filename.parts.disposer)->_vptr_ArrayDisposer)
                      (filename.parts.disposer,pSVar5,0x18,sVar6,sVar6,
                       ArrayDisposer::Dispose_<kj::String,_false>::destruct);
          }
          OneOf<kj::(anonymous_namespace)::InMemoryDirectory::FileNode,_kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode,_kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>
          ::destroy(&local_140);
          pFVar9 = copy.ptr;
          pDVar11 = copy.disposer;
          if (copy.disposer != (Disposer *)0x0) {
            copy.disposer = (Disposer *)0x0;
            copy.ptr = (File *)0x0;
            (**(code **)*puVar3)(puVar3,pDVar11,1,pFVar9,pFVar9,0);
          }
          lVar14 = lVar14 + 0x20;
          entry = local_90;
        } while (lVar15 != lVar14);
      }
      pFVar9 = local_118.ptr;
      pDVar12 = local_118.disposer;
      if (local_118.disposer != (Disposer *)0x0) {
        local_118.disposer = (Disposer *)0x0;
        local_118.ptr = (File *)0x0;
        (**(code **)*local_108)
                  (local_108,pDVar12,0x20,pFVar9,pFVar9,
                   ArrayDisposer::Dispose_<kj::ReadableDirectory::Entry,_false>::destruct);
      }
      file.value.disposer = &refcounted->super_Disposer;
      file.value.ptr = local_100;
      EntryImpl::set(entry,(Own<const_kj::Directory> *)&file);
      pFVar9 = file.value.ptr;
      if (file.value.ptr != (File *)0x0) {
        file.value.ptr = (File *)0x0;
        (**(file.value.disposer)->_vptr_Disposer)
                  (file.value.disposer,
                   (_func_int *)
                   ((long)&(pFVar9->super_ReadableFile).super_FsNode._vptr_FsNode +
                   (long)(pFVar9->super_ReadableFile).super_FsNode._vptr_FsNode[-2]));
      }
    }
    else {
LAB_003488d5:
      EntryImpl::set(entry,&subdir.value);
      fromDirectory_00 = subdir.value.ptr;
    }
    bVar7 = true;
    if (fromDirectory_00 == (Directory *)0x0) {
      return true;
    }
  }
  subdir.value.ptr = (Directory *)0x0;
  pDVar12 = subdir.value.disposer;
LAB_00348942:
  (**pDVar12->_vptr_Disposer)
            (pDVar12,(_func_int *)
                     ((long)&(((ReadableFile *)&fromDirectory_00->super_ReadableDirectory)->
                             super_FsNode)._vptr_FsNode +
                     (long)(((ReadableFile *)&fromDirectory_00->super_ReadableDirectory)->
                           super_FsNode)._vptr_FsNode[-2]));
  return bVar7;
}

Assistant:

bool tryTransferChild(EntryImpl& entry, const FsNode::Type type, kj::Maybe<Date> lastModified,
                          kj::Maybe<uint64_t> size, const Directory& fromDirectory,
                          PathPtr fromPath, TransferMode mode) {
      switch (type) {
        case FsNode::Type::FILE:
          KJ_IF_MAYBE(file, fromDirectory.tryOpenFile(fromPath, WriteMode::MODIFY)) {
            if (mode == TransferMode::COPY) {
              auto copy = newInMemoryFile(clock);
              copy->copy(0, **file, 0, size.orDefault(kj::maxValue));
              entry.set(kj::mv(copy));
            } else {
              if (mode == TransferMode::MOVE) {
                KJ_ASSERT(fromDirectory.tryRemove(fromPath), "couldn't move node", fromPath) {
                  return false;
                }
              }
              entry.set(kj::mv(*file));
            }
            return true;
          } else {
            KJ_FAIL_ASSERT("source node deleted concurrently during transfer", fromPath) {
              return false;
            }
          }